

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

predictor * __thiscall
Search::predictor::add_to<float>
          (predictor *this,v_array<float> *A,bool *A_is_ptr,float *a,size_t count,bool clear_first)

{
  float *pfVar1;
  long lVar2;
  
  lVar2 = (long)A->_end - (long)A->_begin;
  if (lVar2 == 0) {
    if (*A_is_ptr == false) {
      v_array<float>::delete_v(A);
    }
    pfVar1 = a + count;
    if (a == (float *)0x0) {
      pfVar1 = (float *)0x0;
    }
    A->_begin = a;
    A->_end = pfVar1;
    A->end_array = pfVar1;
    *A_is_ptr = true;
  }
  else if (*A_is_ptr == false) {
    if (clear_first) {
      v_array<float>::clear(A);
    }
    if (a != (float *)0x0) {
      push_many<float>(A,a,count);
    }
  }
  else {
    if (clear_first) {
      A->_end = A->_begin;
      lVar2 = 0;
    }
    else {
      lVar2 = lVar2 >> 2;
    }
    make_new_pointer<float>(this,A,count + lVar2);
    *A_is_ptr = false;
    if (a != (float *)0x0) {
      memcpy(A->_begin + lVar2,a,count << 2);
    }
  }
  return this;
}

Assistant:

predictor& predictor::add_to(v_array<T>& A, bool& A_is_ptr, T* a, size_t count, bool clear_first)
{
  size_t old_size = A.size();
  if (old_size > 0)
  {
    if (A_is_ptr)  // we need to make our own memory
    {
      if (clear_first)
      {
        A.end() = A.begin();
        old_size = 0;
      }
      size_t new_size = old_size + count;
      make_new_pointer<T>(A, new_size);
      A_is_ptr = false;
      if (a != nullptr)
        memcpy(A.begin() + old_size, a, count * sizeof(T));
    }
    else  // we already have our own memory
    {
      if (clear_first)
        A.clear();
      if (a != nullptr)
        push_many<T>(A, a, count);
    }
  }
  else  // old_size == 0, clear_first is irrelevant
  {
    if (!A_is_ptr)
      A.delete_v();  // avoid memory leak

    A.begin() = a;
    if (a != nullptr)  // a is not nullptr
      A.end() = a + count;
    else
      A.end() = a;
    A.end_array = A.end();
    A_is_ptr = true;
  }
  return *this;
}